

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

void VELOCYPACK_XXH128_canonicalFromHash(XXH128_canonical_t *dst,XXH128_hash_t hash)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = hash.high64;
  uVar2 = hash.low64;
  *(ulong *)dst->digest =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  *(ulong *)(dst->digest + 8) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  return;
}

Assistant:

XXH_PUBLIC_API void XXH128_canonicalFromHash(XXH128_canonical_t* dst,
                                             XXH128_hash_t hash) {
  XXH_STATIC_ASSERT(sizeof(XXH128_canonical_t) == sizeof(XXH128_hash_t));
  if (XXH_CPU_LITTLE_ENDIAN) {
    hash.high64 = XXH_swap64(hash.high64);
    hash.low64 = XXH_swap64(hash.low64);
  }
  memcpy(dst, &hash.high64, sizeof(hash.high64));
  memcpy((char*)dst + sizeof(hash.high64), &hash.low64, sizeof(hash.low64));
}